

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O0

void __thiscall
WastParser_LongTokenSpace_Test::~WastParser_LongTokenSpace_Test
          (WastParser_LongTokenSpace_Test *this)

{
  WastParser_LongTokenSpace_Test *this_local;
  
  ~WastParser_LongTokenSpace_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(WastParser, LongTokenSpace) {
  std::string text;
  text = "notparen";
  text += repeat(" ", 0x10000);
  text += "notmodule";

  Errors errors = ParseInvalidModule(text);
  ASSERT_EQ(2u, errors.size());

  ASSERT_EQ(ErrorLevel::Error, errors[0].error_level);
  ASSERT_EQ(1, errors[0].loc.line);
  ASSERT_EQ(1, errors[0].loc.first_column);
  ASSERT_STREQ(
      R"(unexpected token "notparen", expected a module field or a module.)",
      errors[0].message.c_str());

  ASSERT_EQ(1, errors[1].loc.line);
  ASSERT_EQ(65545, errors[1].loc.first_column);
  ASSERT_STREQ(R"(unexpected token notmodule, expected EOF.)",
               errors[1].message.c_str());
}